

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

bool __thiscall
Js::ProbeContainer::GetNextUserStatementOffsetForAdvance
          (ProbeContainer *this,FunctionBody *functionBody,ByteCodeReader *reader,int currentOffset,
          int *nextStatementOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined **this_00;
  int currentOffset_00;
  byte unaff_R14B;
  
  this_00 = &PTR_0155fe48;
  puVar3 = (undefined4 *)__tls_get_addr();
  currentOffset_00 = currentOffset;
  do {
    bVar2 = GetNextUserStatementOffsetHelper
                      ((ProbeContainer *)this_00,functionBody,currentOffset_00,SAT_FromCurrentToNext
                       ,nextStatementOffset);
    if (!bVar2) {
      unaff_R14B = 0;
      break;
    }
    this_00 = (undefined **)FunctionBody::GetDiagCatchScopeObjectAt(functionBody,currentOffset_00);
    if (((FunctionBody *)this_00 == (FunctionBody *)0x0) ||
       (bVar2 = DebuggerScope::IsOffsetInScope((DebuggerScope *)this_00,*nextStatementOffset), bVar2
       )) {
      if (*nextStatementOffset <= currentOffset_00) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                    ,0x2c6,"(currentOffset < *nextStatementOffset)",
                                    "currentOffset < *nextStatementOffset");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      this_00 = (undefined **)functionBody;
      bVar2 = IsTmpRegCountIncreased(functionBody,reader,currentOffset,*nextStatementOffset,true);
      if (!bVar2) {
        unaff_R14B = 1;
        goto LAB_008d7c1a;
      }
      currentOffset_00 = *nextStatementOffset;
      bVar2 = true;
    }
    else {
      unaff_R14B = 0;
LAB_008d7c1a:
      bVar2 = false;
    }
  } while (bVar2);
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool ProbeContainer::GetNextUserStatementOffsetForAdvance(Js::FunctionBody* functionBody, ByteCodeReader* reader, int currentOffset, int* nextStatementOffset)
    {
        int originalCurrentOffset = currentOffset;
        while (GetNextUserStatementOffsetHelper(functionBody, currentOffset, FunctionBody::SAT_FromCurrentToNext, nextStatementOffset))
        {
            Js::DebuggerScope *debuggerScope = functionBody->GetDiagCatchScopeObjectAt(currentOffset);
            if (debuggerScope != nullptr && !debuggerScope->IsOffsetInScope(*nextStatementOffset))
            {
                // Our next statement is not within this catch block, So we cannot just jump to it, we need to return false so the stack unwind will happen.
                return false;
            }

            Assert(currentOffset < *nextStatementOffset);

            if (IsTmpRegCountIncreased(functionBody, reader, originalCurrentOffset, *nextStatementOffset, true /*restoreOffset*/))
            {
                currentOffset = *nextStatementOffset;
            }
            else
            {
                return true;
            }
        }

        return false;
    }